

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O1

void __thiscall BufferInputSource::~BufferInputSource(BufferInputSource *this)

{
  Buffer *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__BufferInputSource_002edaa0;
  if ((this->own_memory == true) && (this_00 = this->buf, this_00 != (Buffer *)0x0)) {
    Buffer::~Buffer(this_00);
    operator_delete(this_00,8);
  }
  pcVar1 = (this->description)._M_dataplus._M_p;
  paVar2 = &(this->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

BufferInputSource::~BufferInputSource()
{
    if (this->own_memory) {
        delete this->buf;
    }
}